

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  ostream *poVar3;
  element_type *config;
  code *pcVar4;
  string local_58;
  double local_38;
  double dur;
  Colour local_19;
  SectionStats *pSStack_18;
  Colour colour;
  SectionStats *_sectionStats_local;
  ConsoleReporter *this_local;
  
  pSStack_18 = _sectionStats;
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->(&this->m_tablePrinter);
  TablePrinter::close(this_00,(int)_sectionStats);
  if ((pSStack_18->missingAssertions & 1U) != 0) {
    lazyPrint(this);
    Colour::Colour(&local_19,BrightRed);
    sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
    if (sVar2 < 2) {
      std::operator<<((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                      "\nNo assertions in test case");
    }
    else {
      std::operator<<((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                      "\nNo assertions in section");
    }
    poVar3 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             " \'");
    poVar3 = std::operator<<(poVar3,(string *)&pSStack_18->sectionInfo);
    poVar3 = std::operator<<(poVar3,"\'\n");
    pcVar4 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Colour::~Colour(&local_19);
    _sectionStats = (SectionStats *)pcVar4;
  }
  local_38 = pSStack_18->durationInSeconds;
  config = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  bVar1 = shouldShowDuration(config,local_38);
  if (bVar1) {
    poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    getFormattedDuration_abi_cxx11_(&local_58,(Catch *)_sectionStats,local_38);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    poVar3 = std::operator<<(poVar3," s: ");
    poVar3 = std::operator<<(poVar3,(string *)&pSStack_18->sectionInfo);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_headerPrinted & 1U) != 0) {
    this->m_headerPrinted = false;
  }
  StreamingReporterBase<Catch::ConsoleReporter>::sectionEnded
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,pSStack_18);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        Colour colour(Colour::ResultError);
        if (m_sectionStack.size() > 1)
            stream << "\nNo assertions in section";
        else
            stream << "\nNo assertions in test case";
        stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}